

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

double __thiscall
KMaxDistance::compute
          (KMaxDistance *this,double *xEdgeCosts,double *yEdgeCosts,int width,int height,
          int numDistMaxs,int *srcPixs,int numSrcPixs,int dstPix,double *dists,int *backPtrs,
          double *maxVector)

{
  void *__ptr;
  void *__ptr_00;
  MaxRec *__src;
  NodeAVL *pNVar1;
  void *pvVar2;
  int in_ECX;
  MaxRec *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  int i_4;
  MaxRec *backRec;
  int in_stack_00000018;
  int backIdx;
  int i_3;
  int i_2;
  double minSum;
  MaxRec *m;
  double retVal;
  int x;
  int y;
  int imgIdx_1;
  MaxRec *minDistRec;
  MaxRec *rec;
  int imgIdx;
  int i_1;
  NodeAVL *queue;
  int i;
  MaxRec *prevPtrs;
  MaxRec **maxs;
  int cnt;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  double in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar3;
  double dVar4;
  long *plVar5;
  int local_54;
  int local_44;
  double local_8;
  
  if (in_R9D < 0x29) {
    if (in_R9D < 1) {
      fprintf(_stderr,"ERROR: numDistMaxs has to be positive.\n");
      local_8 = 0.0;
    }
    else if ((int)backRec < 1) {
      fprintf(_stderr,"ERROR: no source points found.\n");
      local_8 = 0.0;
    }
    else {
      *(undefined4 *)&in_RDI->next = 0;
      *(undefined4 *)((long)&in_RDI->next + 4) = 0;
      *(int *)&in_RDI->qPtr = in_R9D;
      if (_i_3 == (void *)0x0) {
        _i_3 = malloc((long)(in_ECX * in_R8D) << 3);
      }
      __ptr = malloc((long)(in_ECX * in_R8D) << 3);
      __ptr_00 = malloc((long)(in_ECX * in_R8D) << 6);
      for (local_44 = 0; local_44 < in_ECX * in_R8D; local_44 = local_44 + 1) {
        *(undefined8 *)((long)__ptr + (long)local_44 * 8) = 0;
        *(undefined8 *)((long)_i_3 + (long)local_44 * 8) = 0x4197d78400000000;
      }
      for (local_54 = 0; local_54 < (int)backRec; local_54 = local_54 + 1) {
        iVar3 = *(int *)(in_stack_00000008 + (long)local_54 * 4);
        __src = createNewMaxRec((KMaxDistance *)
                                CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                                SUB84(in_stack_ffffffffffffff58,0));
        __src->wasMin = 1;
        pNVar1 = avlInsert((NodeAVL **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                           ,in_stack_ffffffffffffff58,
                           (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        __src->qPtr = pNVar1;
        *(MaxRec **)((long)__ptr + (long)iVar3 * 8) = __src;
        if (__ptr_00 != (void *)0x0) {
          memcpy((void *)((long)__ptr_00 + (long)iVar3 * 0x40),__src,0x40);
        }
      }
      iVar3 = in_stack_00000018;
      if (in_stack_00000018 < 1) {
        iVar3 = -in_stack_00000018;
      }
      local_8 = *(double *)((long)_i_3 + (long)iVar3 * 8);
      if (m != (MaxRec *)0x0) {
        iVar3 = in_stack_00000018;
        if (in_stack_00000018 < 1) {
          iVar3 = -in_stack_00000018;
        }
        plVar5 = *(long **)((long)__ptr + (long)iVar3 * 8);
        dVar4 = (double)plVar5[5];
        for (iVar3 = 0; iVar3 < (int)plVar5[6]; iVar3 = iVar3 + 1) {
          m->vals[(long)iVar3 + -7] = (double)plVar5[(long)iVar3 + 7];
        }
        while (*plVar5 != 0) {
          plVar5 = (long *)*plVar5;
          if ((double)plVar5[5] < dVar4) {
            dVar4 = (double)plVar5[5];
            for (iVar3 = 0; iVar3 < (int)plVar5[6]; iVar3 = iVar3 + 1) {
              m->vals[(long)iVar3 + -7] = (double)plVar5[(long)iVar3 + 7];
            }
          }
        }
      }
      if (minSum != 0.0) {
        if (in_stack_00000018 < 1) {
          in_stack_00000018 = -in_stack_00000018;
        }
        iVar3 = 0;
        for (pvVar2 = (void *)((long)__ptr_00 + (long)in_stack_00000018 * 0x40);
            pvVar2 != (void *)0x0; pvVar2 = *(void **)((long)pvVar2 + 8)) {
          *(undefined4 *)((long)minSum + (long)iVar3 * 4) = *(undefined4 *)((long)pvVar2 + 0x20);
          iVar3 = iVar3 + 1;
        }
        *(undefined4 *)((long)minSum + (long)iVar3 * 4) = 0xffffffff;
      }
      for (iVar3 = 0; iVar3 < in_ECX * in_R8D; iVar3 = iVar3 + 1) {
        freeMaxRecs((KMaxDistance *)CONCAT44(iVar3,in_stack_ffffffffffffff50),in_RDI);
      }
      free(__ptr);
      free((void *)0x0);
      free(__ptr_00);
    }
  }
  else {
    fprintf(_stderr,"ERROR: numDistMaxs is too big (increase MAX_NUM_MAXS).\n");
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double KMaxDistance::compute( const double *xEdgeCosts, const double *yEdgeCosts, const int width, const int height, const int numDistMaxs,
    const int *srcPixs, const int numSrcPixs, const int dstPix, double *dists, int* backPtrs, double *maxVector ){

    if ( numDistMaxs > MAX_NUM_MAXS ){ fprintf(stderr, "ERROR: numDistMaxs is too big (increase MAX_NUM_MAXS).\n" ); return 0.0; }
    if ( numDistMaxs < 1 ){ fprintf(stderr, "ERROR: numDistMaxs has to be positive.\n" ); return 0.0; }
    if ( numSrcPixs < 1 ){ fprintf(stderr, "ERROR: no source points found.\n" ); return 0.0; }

    numMaxRecs = 0;
    numMaxRecsInOneNode = 0;
    numDistMaxsGl = numDistMaxs;

	int cnt = 0;
    //double *dists;
    if ( dists == NULL ) dists = (double*)malloc( width*height*sizeof( dists[0] )); // else dists = distsExt; 
    MaxRec **maxs = (MaxRec**)malloc( width*height*sizeof( maxs[0] ));
    MaxRec* prevPtrs = (MaxRec*)malloc( width*height*sizeof( prevPtrs[0] ));
    
    for ( int i = 0; i < width*height; ++i ) 
    {
		maxs[i] = NULL;
		dists[i] = MAX_GEO_DIST;
	}

    NodeAVL *queue = NULL;

    for ( int i = 0; i < numSrcPixs; ++i ){
        int imgIdx = srcPixs[i];
        MaxRec *rec = createNewMaxRec( imgIdx, numDistMaxs );
        rec->wasMin = 1;
        rec->qPtr = avlInsert( &queue, 0.0, rec );
        maxs[imgIdx] = rec;
        if ( prevPtrs != NULL ) prevPtrs[imgIdx] = *rec;
    }

	
    while ( queue != NULL )
    {

        MaxRec *minDistRec = (MaxRec*)avlFindAndDeleteMin( &queue );

        if ( !minDistRec->isUsed ) continue;
        
        minDistRec->wasMin = 1;
        int imgIdx = minDistRec->imgIdx;
        
        if ( minDistRec->sumVals < dists[imgIdx] ){ 
            if ( dists[imgIdx] > MAX_GEO_DIST - GEO_MAX_EPSX ) cnt++;
            dists[imgIdx] = minDistRec->sumVals;
            prevPtrs[imgIdx] = *minDistRec;
            if ( cnt == width*height ) break;
        }
        
        if ( dstPix >= 0 ){ if ( dists[dstPix] < MAX_GEO_DIST ) break; }
        
        int y = imgIdx/width, x = imgIdx - y*width;
        if ( x > 0 )        addPathToNodeAVL( minDistRec,     imgIdx-1,     xEdgeCosts[imgIdx-1], numDistMaxs, maxs, &queue );
        if ( x < width-1 )  addPathToNodeAVL( minDistRec,     imgIdx+1,       xEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );
        if ( y > 0 )        addPathToNodeAVL( minDistRec, imgIdx-width, yEdgeCosts[imgIdx-width], numDistMaxs, maxs, &queue );
        if ( y < height-1 ) addPathToNodeAVL( minDistRec, imgIdx+width,       yEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );

    }


    double retVal = 0.0;
    retVal = dists[abs(dstPix)];

    if ( maxVector != NULL ) 
    {
        MaxRec* m = maxs[abs(dstPix)];
        double minSum = m->sumVals;
        for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];

        while(m->next != NULL)
        {
            m = (MaxRec*) m->next;
            if(m->sumVals < minSum)
            {
                minSum = m->sumVals;
                for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];
            }
        }
    }

    if ( backPtrs != NULL ) 
    {
        int backIdx = 0;
        MaxRec* backRec = &prevPtrs[abs(dstPix)];
        while(backRec != NULL)
        {
            backPtrs[backIdx++] = backRec->imgIdx;
            backRec = (MaxRec*) backRec->back;
        }
        backPtrs[backIdx++] = -1;
    }
    
    while ( queue != NULL ) avlFindAndDeleteMin( &queue );
    
    #ifdef DEBUG_MODE
    meanNumRecs = (double)numMaxRecs/(double)(width*height);
    maxNumRecsInNode = numMaxRecsInOneNode;
    printf("meanNumRecs: %.2lf\n", meanNumRecs);
    printf("maxNumRecsInNode: %d\n", maxNumRecsInNode);
    #endif

    for ( int i = 0; i < width*height; ++i ) freeMaxRecs( maxs[i] );
    free( maxs ); 
    free( queue );
    free( prevPtrs );
    //if ( distsExt == NULL ) free( dists );

    return retVal;

}